

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionFunctionHandle::execute
          (ExpressionValue *__return_storage_ptr__,ExpressionFunctionHandle *this,
          vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
          *parameters)

{
  size_type sVar1;
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  *parameters_local;
  ExpressionFunctionHandle *this_local;
  
  sVar1 = std::
          vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
          ::size(parameters);
  if ((this->impl->minParams <= sVar1) &&
     (sVar1 = std::
              vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
              ::size(parameters), sVar1 <= this->impl->maxParams)) {
    std::
    function<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&)>
    ::operator()(__return_storage_ptr__,&this->impl->f,parameters);
    return __return_storage_ptr__;
  }
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionFunctionHandle::execute(const std::vector<std::unique_ptr<ExpressionInternal> > &parameters) const
{
	if (parameters.size() < impl.minParams || parameters.size() > impl.maxParams)
		return {};

	return impl.f(parameters);
}